

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

string * jwt::base::pad(string *__return_storage_ptr__,string *base,string *fill)

{
  string padding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  switch((uint)base->_M_string_length & 3) {
  case 1:
    std::__cxx11::string::append((string *)&local_38);
  case 2:
    std::__cxx11::string::append((string *)&local_38);
  case 3:
    std::__cxx11::string::append((string *)&local_38);
  case 0:
    std::operator+(__return_storage_ptr__,base,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
}

Assistant:

static std::string pad(const std::string& base, const std::string& fill) {
			std::string padding;
			switch (base.size() % 4) {
				case 1:
					padding += fill;
					JWT_FALLTHROUGH;
				case 2:
					padding += fill;
					JWT_FALLTHROUGH;
				case 3:
					padding += fill;
					JWT_FALLTHROUGH;
				default:
					break;
			}

			return base + padding;
		}